

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_should_fail(connectdata *conn)

{
  char cVar1;
  int iVar2;
  SessionHandle *pSVar3;
  uint uVar4;
  
  pSVar3 = conn->data;
  iVar2 = (pSVar3->req).httpcode;
  uVar4 = 0;
  if ((399 < iVar2 & (pSVar3->set).http_fail_on_error) == 1) {
    uVar4 = 1;
    if (iVar2 == 0x197) {
      cVar1 = (conn->bits).proxy_user_passwd;
    }
    else {
      if (iVar2 != 0x191) {
        return 1;
      }
      cVar1 = (conn->bits).user_passwd;
    }
    if (cVar1 == '\x01') {
      uVar4 = (uint)(pSVar3->state).authproblem;
    }
  }
  return uVar4;
}

Assistant:

static int http_should_fail(struct connectdata *conn)
{
  struct SessionHandle *data;
  int httpcode;

  DEBUGASSERT(conn);
  data = conn->data;
  DEBUGASSERT(data);

  httpcode = data->req.httpcode;

  /*
  ** If we haven't been asked to fail on error,
  ** don't fail.
  */
  if(!data->set.http_fail_on_error)
    return 0;

  /*
  ** Any code < 400 is never terminal.
  */
  if(httpcode < 400)
    return 0;

  /*
  ** Any code >= 400 that's not 401 or 407 is always
  ** a terminal error
  */
  if((httpcode != 401) &&
      (httpcode != 407))
    return 1;

  /*
  ** All we have left to deal with is 401 and 407
  */
  DEBUGASSERT((httpcode == 401) || (httpcode == 407));

  /*
  ** Examine the current authentication state to see if this
  ** is an error.  The idea is for this function to get
  ** called after processing all the headers in a response
  ** message.  So, if we've been to asked to authenticate a
  ** particular stage, and we've done it, we're OK.  But, if
  ** we're already completely authenticated, it's not OK to
  ** get another 401 or 407.
  **
  ** It is possible for authentication to go stale such that
  ** the client needs to reauthenticate.  Once that info is
  ** available, use it here.
  */

  /*
  ** Either we're not authenticating, or we're supposed to
  ** be authenticating something else.  This is an error.
  */
  if((httpcode == 401) && !conn->bits.user_passwd)
    return TRUE;
  if((httpcode == 407) && !conn->bits.proxy_user_passwd)
    return TRUE;

  return data->state.authproblem;
}